

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

opj_bool jp2_read_pclr_v2(opj_jp2_v2_t *jp2,uchar *p_pclr_header_data,OPJ_UINT32 p_pclr_header_size,
                         opj_event_mgr_t *p_manager)

{
  OPJ_BYTE *in_RSI;
  long in_RDI;
  OPJ_UINT32 l_value;
  OPJ_UINT16 j;
  OPJ_UINT16 i;
  OPJ_UINT16 nr_channels;
  OPJ_UINT16 nr_entries;
  OPJ_UINT32 *entries;
  OPJ_BYTE *channel_sign;
  OPJ_BYTE *channel_size;
  opj_jp2_pclr_t *jp2_pclr;
  uint local_54;
  ushort local_50;
  ushort local_4e;
  ushort local_4c;
  ushort local_4a;
  uint *local_48;
  void *local_40;
  void *local_38;
  undefined8 *local_30;
  OPJ_BYTE *local_18;
  long local_10;
  opj_bool local_4;
  
  if (*(long *)(in_RDI + 0x88) == 0) {
    local_18 = in_RSI;
    local_10 = in_RDI;
    opj_read_bytes_LE(in_RSI,&local_54,2);
    local_18 = local_18 + 2;
    local_4a = (ushort)local_54;
    opj_read_bytes_LE(local_18,&local_54,1);
    local_18 = local_18 + 1;
    local_4c = (ushort)local_54;
    local_48 = (uint *)malloc((long)(int)((local_54 & 0xffff) * (uint)local_4a) << 2);
    local_38 = malloc((ulong)local_4c);
    local_40 = malloc((ulong)local_4c);
    local_30 = (undefined8 *)malloc(0x28);
    local_30[1] = local_40;
    local_30[2] = local_38;
    *local_30 = local_48;
    *(ushort *)(local_30 + 4) = local_4a;
    *(ushort *)((long)local_30 + 0x22) = local_4c;
    local_30[3] = 0;
    *(undefined8 **)(local_10 + 0x88) = local_30;
    for (local_4e = 0; local_4e < local_4c; local_4e = local_4e + 1) {
      opj_read_bytes_LE(local_18,&local_54,1);
      local_18 = local_18 + 1;
      *(byte *)((long)local_38 + (ulong)local_4e) = ((byte)local_54 & 0x7f) + 1;
      *(bool *)((long)local_40 + (ulong)local_4e) = (local_54 & 0x80) != 0;
    }
    for (local_50 = 0; local_50 < local_4a; local_50 = local_50 + 1) {
      for (local_4e = 0; local_4e < local_4c; local_4e = local_4e + 1) {
        opj_read_bytes_LE(local_18,&local_54,
                          (int)(uint)*(byte *)((long)local_38 + (ulong)local_4e) >> 3);
        local_18 = local_18 + ((int)(uint)*(byte *)((long)local_38 + (ulong)local_4e) >> 3);
        *local_48 = local_54;
        local_48 = local_48 + 1;
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

opj_bool jp2_read_pclr_v2(	opj_jp2_v2_t *jp2,
							unsigned char * p_pclr_header_data,
							OPJ_UINT32 p_pclr_header_size,
							opj_event_mgr_t * p_manager
						  ){
	opj_jp2_pclr_t *jp2_pclr;
	OPJ_BYTE *channel_size, *channel_sign;
	OPJ_UINT32 *entries;
	OPJ_UINT16 nr_entries,nr_channels;
	OPJ_UINT16 i, j;
	OPJ_UINT32 l_value;

	/* preconditions */
	assert(p_pclr_header_data != 00);
	assert(jp2 != 00);
	assert(p_manager != 00);

	if(jp2->color.jp2_pclr)
		return OPJ_FALSE;

	opj_read_bytes(p_pclr_header_data, &l_value , 2);	/* NE */
	p_pclr_header_data += 2;
	nr_entries = (OPJ_UINT16) l_value;

	opj_read_bytes(p_pclr_header_data, &l_value , 1);	/* NPC */
	++p_pclr_header_data;
	nr_channels = (OPJ_UINT16) l_value;

	entries = (OPJ_UINT32*) opj_malloc(nr_channels * nr_entries * sizeof(OPJ_UINT32));
	channel_size = (OPJ_BYTE*) opj_malloc(nr_channels);
	channel_sign = (OPJ_BYTE*) opj_malloc(nr_channels);

	jp2_pclr = (opj_jp2_pclr_t*)opj_malloc(sizeof(opj_jp2_pclr_t));
	jp2_pclr->channel_sign = channel_sign;
	jp2_pclr->channel_size = channel_size;
	jp2_pclr->entries = entries;
	jp2_pclr->nr_entries = nr_entries;
	jp2_pclr->nr_channels = nr_channels;
	jp2_pclr->cmap = NULL;

	jp2->color.jp2_pclr = jp2_pclr;

	for(i = 0; i < nr_channels; ++i) {
		opj_read_bytes(p_pclr_header_data, &l_value , 1);	/* Bi */
		++p_pclr_header_data;

		channel_size[i] = (l_value & 0x7f) + 1;
		channel_sign[i] = (l_value & 0x80)? 1 : 0;
	}

	for(j = 0; j < nr_entries; ++j) {
		for(i = 0; i < nr_channels; ++i) {
			/**entries++ = cio_read(cio, channel_size[i]>>3); */
			opj_read_bytes(p_pclr_header_data, &l_value , channel_size[i]>>3);	/* Cji */
			p_pclr_header_data += channel_size[i]>>3;
			*entries = (OPJ_UINT32) l_value;
			entries++;
		}
	}

	return OPJ_TRUE;
}